

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

VertexFacetType ON_SubD::VertexFacetTypeFromUnsigned(uint vertex_facet_type_as_unsigned)

{
  switch(vertex_facet_type_as_unsigned) {
  case 0:
    return Unset;
  case 1:
  case 2:
    goto switchD_005c345d_caseD_1;
  case 3:
    return Tri;
  case 4:
    return Quad;
  case 5:
    return Ngon;
  default:
    if (vertex_facet_type_as_unsigned == 0xff) {
      return Mixed;
    }
switchD_005c345d_caseD_1:
    ON_SubDIncrementErrorCount();
    return Unset;
  }
}

Assistant:

ON_SubD::VertexFacetType ON_SubD::VertexFacetTypeFromUnsigned(
  unsigned int vertex_facet_type_as_unsigned
  )
{
  switch (vertex_facet_type_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubD::VertexFacetType::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubD::VertexFacetType::Tri);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubD::VertexFacetType::Quad);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubD::VertexFacetType::Ngon);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubD::VertexFacetType::Mixed);
  }
  return ON_SUBD_RETURN_ERROR(ON_SubD::VertexFacetType::Unset);
}